

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O3

void irr::video::CColorConverter::convert_B8G8R8toA8R8G8B8(void *sP,s32 sN,void *dP)

{
  long lVar1;
  u32 *dB;
  u8 *sB;
  undefined2 *puVar2;
  
  if (0 < sN) {
    puVar2 = (undefined2 *)((long)sP + 1);
    lVar1 = 0;
    do {
      *(uint *)((long)dP + lVar1 * 4) =
           CONCAT21(*puVar2,*(undefined1 *)((long)puVar2 + -1)) | 0xff000000;
      lVar1 = lVar1 + 1;
      puVar2 = (undefined2 *)((long)puVar2 + 3);
    } while (sN != (int)lVar1);
  }
  return;
}

Assistant:

void CColorConverter::convert_B8G8R8toA8R8G8B8(const void *sP, s32 sN, void *dP)
{
	u8 *sB = (u8 *)sP;
	u32 *dB = (u32 *)dP;

	for (s32 x = 0; x < sN; ++x) {
		*dB = 0xff000000 | (sB[2] << 16) | (sB[1] << 8) | sB[0];

		sB += 3;
		++dB;
	}
}